

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *in_RSI;
  TPZSavable *in_RDI;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffb8;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_02578470);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)(in_RDI + 0x1e),&PTR_construction_vtable_136__02578460);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer
            ((TPZAutoPointer<TPZCompMesh> *)in_RDI,in_stack_ffffffffffffffb8);
  TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::TPZStructMatrix
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer((TPZAutoPointer<TPZCompMesh> *)in_RDI);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<double,TPZStructMatrixTBBFlow<double>>::vtable + 0x68);
  in_RDI[0x1e]._vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<double,TPZStructMatrixTBBFlow<double>>::vtable + 0x228);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<double,TPZStructMatrixTBBFlow<double>>::vtable + 0x68);
  in_RDI[0x14]._vptr_TPZSavable =
       (_func_int **)
       (TPZSkylineNSymStructMatrix<double,TPZStructMatrixTBBFlow<double>>::vtable + 0x130);
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}